

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectPath(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *vPath;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = p->nLevels;
  vPath = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vPath->nSize = 0;
  vPath->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  vPath->pArray = piVar2;
  uVar3 = *(ulong *)pObj & 0x1fffffff;
  uVar5 = 0;
  if (uVar3 != 0x1fffffff) {
    uVar5 = -uVar3;
  }
  Gia_ManCollectPath_rec(p,pObj + (uVar5 & (long)(int)*(ulong *)pObj >> 0x1f),vPath);
  return vPath;
}

Assistant:

Vec_Int_t * Gia_ManCollectPath( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vPath = Vec_IntAlloc( p->nLevels );
    Gia_ManCollectPath_rec( p, Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj, vPath );
    return vPath;
}